

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>>::
emplace<std::_Rb_tree_const_iterator<Node<Read>>const&>
          (QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>> *this,qsizetype i,
          _Rb_tree_const_iterator<Node<Read>_> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar5 = *(long *)(this + 0x10);
    if ((lVar5 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) + lVar5)) {
      *(_Base_ptr *)(*(long *)(this + 8) + lVar5 * 8) = args->_M_node;
      goto LAB_001119b9;
    }
    if (((i == 0) && (piVar2 != (int *)0x0)) &&
       (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      *(_Base_ptr *)(*(long *)(this + 8) + -8) = args->_M_node;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
      goto LAB_001119b9;
    }
  }
  p_Var3 = args->_M_node;
  lVar5 = *(long *)(this + 0x10);
  QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>::detachAndGrow
            ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)this,
             (uint)(i == 0 && lVar5 != 0),1,(_Rb_tree_const_iterator<Node<Read>_> **)0x0,
             (QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x0);
  lVar4 = *(long *)(this + 8);
  if (i == 0 && lVar5 != 0) {
    *(_Base_ptr *)(lVar4 + -8) = p_Var3;
    *(long *)(this + 8) = *(long *)(this + 8) + -8;
    lVar5 = *(long *)(this + 0x10);
  }
  else {
    puVar1 = (undefined8 *)(lVar4 + i * 8);
    memmove(puVar1 + 1,(void *)(lVar4 + i * 8),(*(long *)(this + 0x10) - i) * 8);
    *puVar1 = p_Var3;
    lVar5 = *(long *)(this + 0x10);
  }
LAB_001119b9:
  *(long *)(this + 0x10) = lVar5 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }